

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteIndent(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  int local_20;
  int ret;
  int i;
  int lksize;
  xmlTextWriterPtr writer_local;
  
  iVar1 = xmlListSize(writer->nodes);
  if (iVar1 < 1) {
    writer_local._4_4_ = -1;
  }
  else {
    for (local_20 = 0; local_20 < iVar1 + -1; local_20 = local_20 + 1) {
      iVar2 = xmlOutputBufferWriteString(writer->out,(char *)writer->ichar);
      if (iVar2 == -1) {
        return -1;
      }
    }
    writer_local._4_4_ = iVar1 + -1;
  }
  return writer_local._4_4_;
}

Assistant:

static int
xmlTextWriterWriteIndent(xmlTextWriterPtr writer)
{
    int lksize;
    int i;
    int ret;

    lksize = xmlListSize(writer->nodes);
    if (lksize < 1)
        return (-1);            /* list is empty */
    for (i = 0; i < (lksize - 1); i++) {
        ret = xmlOutputBufferWriteString(writer->out,
                                         (const char *) writer->ichar);
        if (ret == -1)
            return (-1);
    }

    return (lksize - 1);
}